

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

string * __thiscall
ast::Unary_expression::to_string_abi_cxx11_(string *__return_storage_ptr__,Unary_expression *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Unary_expression *local_18;
  Unary_expression *this_local;
  
  local_18 = this;
  this_local = (Unary_expression *)__return_storage_ptr__;
  switch(this->operation) {
  case 0x111:
    (*this->expression->_vptr_Expression[2])();
    std::operator+(__return_storage_ptr__,"~",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    break;
  case 0x114:
    (*this->expression->_vptr_Expression[2])();
    std::operator+(__return_storage_ptr__,"!",&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    break;
  case 0x117:
    (*this->expression->_vptr_Expression[2])();
    std::operator+(__return_storage_ptr__,"+",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case 0x118:
    (*this->expression->_vptr_Expression[2])();
    std::operator+(__return_storage_ptr__,"-",&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

string Unary_expression::to_string()
{
	switch (this->operation) {
	case PLUS:
		return "+" + expression->to_string();
	case MINUS:
		return "-" + expression->to_string();
	case TILDE:
		return "~" + expression->to_string();
	case EXCLAMATION:
		return "!" + expression->to_string();
	default:
		return string();
	}
}